

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O3

void __thiscall
banksia::ChessBoard::gen_addPawnMove
          (ChessBoard *this,vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *moveList,
          int from,int dest,bool captureOnly)

{
  pointer *ppMVar1;
  pointer pPVar2;
  PieceType PVar3;
  ulong uVar4;
  Side SVar5;
  ulong uVar6;
  ulong uVar7;
  iterator iVar8;
  MoveFull local_34;
  
  uVar7 = (ulong)dest;
  pPVar2 = (this->super_BoardCore).pieces.
           super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (long)(this->super_BoardCore).pieces.
                super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pPVar2 >> 3;
  uVar4 = uVar7;
  if ((uVar7 < uVar6) && (uVar4 = (ulong)from, uVar4 < uVar6)) {
    SVar5 = pPVar2[uVar4].side;
    if ((SVar5 != pPVar2[uVar7].side) && ((ulong)pPVar2[uVar7] >> 0x20 != 2 || !captureOnly)) {
      local_34.piece.type = pPVar2[uVar4].type;
      PVar3 = local_34.piece.type;
      if (dest - 8U < 0x30) {
        local_34.super_Move.promotion = empty;
        iVar8._M_current =
             (moveList->super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>).
             _M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        local_34.super_Move.promotion = queen;
        iVar8._M_current =
             (moveList->super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (moveList->super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_34.super_Move.from = from;
          local_34.super_Move.dest = dest;
          local_34.piece.side = SVar5;
          std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::
          _M_realloc_insert<banksia::MoveFull>(moveList,iVar8,&local_34);
          iVar8._M_current =
               (moveList->super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>)
               ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          ((iVar8._M_current)->piece).side = SVar5;
          ((iVar8._M_current)->super_Move).from = from;
          ((iVar8._M_current)->super_Move).dest = dest;
          *(ulong *)&((iVar8._M_current)->super_Move).promotion = CONCAT44(local_34.piece.type,2);
          iVar8._M_current =
               (moveList->super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>)
               ._M_impl.super__Vector_impl_data._M_finish + 1;
          (moveList->super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>).
          _M_impl.super__Vector_impl_data._M_finish = iVar8._M_current;
        }
        local_34.super_Move.promotion = rook;
        if (iVar8._M_current ==
            (moveList->super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_34.super_Move.from = from;
          local_34.super_Move.dest = dest;
          local_34.piece.type = PVar3;
          local_34.piece.side = SVar5;
          std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::
          _M_realloc_insert<banksia::MoveFull>(moveList,iVar8,&local_34);
          iVar8._M_current =
               (moveList->super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>)
               ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          ((iVar8._M_current)->piece).side = SVar5;
          ((iVar8._M_current)->super_Move).from = from;
          ((iVar8._M_current)->super_Move).dest = dest;
          *(ulong *)&((iVar8._M_current)->super_Move).promotion = CONCAT44(PVar3,3);
          iVar8._M_current =
               (moveList->super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>)
               ._M_impl.super__Vector_impl_data._M_finish + 1;
          (moveList->super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>).
          _M_impl.super__Vector_impl_data._M_finish = iVar8._M_current;
        }
        local_34.super_Move.promotion = bishop;
        if (iVar8._M_current ==
            (moveList->super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_34.super_Move.from = from;
          local_34.super_Move.dest = dest;
          local_34.piece.type = PVar3;
          local_34.piece.side = SVar5;
          std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::
          _M_realloc_insert<banksia::MoveFull>(moveList,iVar8,&local_34);
          iVar8._M_current =
               (moveList->super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>)
               ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          ((iVar8._M_current)->piece).side = SVar5;
          ((iVar8._M_current)->super_Move).from = from;
          ((iVar8._M_current)->super_Move).dest = dest;
          *(ulong *)&((iVar8._M_current)->super_Move).promotion = CONCAT44(PVar3,4);
          iVar8._M_current =
               (moveList->super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>)
               ._M_impl.super__Vector_impl_data._M_finish + 1;
          (moveList->super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>).
          _M_impl.super__Vector_impl_data._M_finish = iVar8._M_current;
        }
        local_34.super_Move.promotion = knight;
      }
      if (iVar8._M_current ==
          (moveList->super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_34.super_Move.from = from;
        local_34.super_Move.dest = dest;
        local_34.piece.type = PVar3;
        local_34.piece.side = SVar5;
        std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::
        _M_realloc_insert<banksia::MoveFull>(moveList,iVar8,&local_34);
      }
      else {
        ((iVar8._M_current)->piece).side = SVar5;
        ((iVar8._M_current)->super_Move).from = from;
        ((iVar8._M_current)->super_Move).dest = dest;
        *(ulong *)&((iVar8._M_current)->super_Move).promotion =
             CONCAT44(PVar3,local_34.super_Move.promotion);
        ppMVar1 = &(moveList->
                   super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppMVar1 = *ppMVar1 + 1;
      }
    }
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4);
}

Assistant:

void ChessBoard::gen_addPawnMove(std::vector<MoveFull>& moveList, int from, int dest, bool captureOnly) const
{
    auto toSide = getPiece(dest).side;
    auto movingPiece = getPiece(from);
    auto fromSide = movingPiece.side;
    
    assert(movingPiece.type == PieceType::pawn);
    if (fromSide != toSide && (!captureOnly || toSide != Side::none)) {
        if (dest >= 8 && dest < 56) {
            moveList.push_back(MoveFull(movingPiece, from, dest));
        } else {
            moveList.push_back(MoveFull(movingPiece, from, dest, PieceType::queen));
            moveList.push_back(MoveFull(movingPiece, from, dest, PieceType::rook));
            moveList.push_back(MoveFull(movingPiece, from, dest, PieceType::bishop));
            moveList.push_back(MoveFull(movingPiece, from, dest, PieceType::knight));
        }
    }
}